

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyInternal<false>
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex index,Var value,ObjectSlotAttributes attr,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects,bool isInit)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  Type *pTVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  uint uVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  ObjectSlotAttributes *instanceAttributes;
  DynamicTypeHandler *pDVar10;
  PathTypeHandlerBase *this_00;
  undefined7 in_register_00000089;
  uint32 local_40;
  undefined4 local_3c;
  uint32 indexVal;
  
  local_3c = (undefined4)CONCAT71(in_register_00000089,attr);
  _indexVal = value;
  if (0xf < (uint)propertyId && value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x31d,"(value != nullptr || IsInternalPropertyId(propertyId))",
                                "value != nullptr || IsInternalPropertyId(propertyId)");
    if (!bVar5) goto LAB_00dd7ef9;
    *puVar9 = 0;
  }
  pSVar1 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,IsConcatSpreadableCachePhase);
  if ((propertyId == 0x13) && (!bVar5)) {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar2 = pSVar1->threadContext;
    (pTVar2->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar2->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  pTVar3 = (instance->super_RecyclableObject).type.ptr;
  if (index == 0xffff) {
    BVar7 = ScriptContext::IsNumericPropertyId
                      ((((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr,propertyId,&local_40);
    if (BVar7 == 0) {
      BVar7 = AddPropertyInternal(this,instance,propertyId,_indexVal,(ObjectSlotAttributes)local_3c,
                                  info,flags,possibleSideEffects);
    }
    else {
      BVar7 = DynamicTypeHandler::SetItem
                        (&this->super_DynamicTypeHandler,instance,local_40,_indexVal,
                         PropertyOperation_None);
    }
  }
  else {
    if ((*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01') &&
       (((this->super_DynamicTypeHandler).flags & 0x10) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x327,
                                  "(!instance->GetDynamicType()->GetIsShared() || GetIsShared())",
                                  "!instance->GetDynamicType()->GetIsShared() || GetIsShared()");
      if (!bVar5) {
LAB_00dd7ef9:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    if (isInit) {
      iVar6 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
      instanceAttributes = (ObjectSlotAttributes *)CONCAT44(extraout_var,iVar6);
      bVar5 = true;
      if ((instanceAttributes != (ObjectSlotAttributes *)0x0) &&
         ((instanceAttributes[index] & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None)) {
        BVar7 = SetAttributesHelper(this,instance,propertyId,index,instanceAttributes,
                                    instanceAttributes[index] & ~ObjectSlotAttr_Accessor,true);
        if (BVar7 == 0) {
          pDVar10 = DynamicObject::GetTypeHandler(instance);
          uVar8 = (*pDVar10->_vptr_DynamicTypeHandler[0x16])
                            (pDVar10,instance,(ulong)(uint)propertyId,_indexVal,(ulong)flags,info);
          instanceAttributes = (ObjectSlotAttributes *)(ulong)uVar8;
        }
        else {
          if (info != (PropertyValueInfo *)0x0) {
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = 0xffff;
            info->m_attributes = '\0';
            info->flags = InlineCacheNoFlags;
          }
          FromTypeHandler(*(DynamicTypeHandler **)((instance->super_RecyclableObject).type.ptr + 1))
          ;
          DynamicTypeHandler::SetSlotUnchecked(instance,(uint)index,_indexVal);
          instanceAttributes = &DAT_00000001;
        }
        bVar5 = false;
      }
      if (!bVar5) {
        return (BOOL)instanceAttributes;
      }
    }
    this_00 = FromTypeHandler(*(DynamicTypeHandler **)
                               ((instance->super_RecyclableObject).type.ptr + 1));
    SetSlotAndCache(this_00,instance,propertyId,(PropertyRecord *)0x0,index,_indexVal,info,flags,
                    possibleSideEffects);
    BVar7 = 1;
  }
  return BVar7;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyInternal(DynamicObject* instance, PropertyId propertyId, PropertyIndex index, Var value, ObjectSlotAttributes attr, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects, bool isInit)
    {
        PathTypeHandlerBase *newTypeHandler = nullptr;

        // Path type handler doesn't support pre-initialization (PropertyOperation_PreInit). Pre-initialized properties
        // will get marked as fixed when pre-initialized and then as non-fixed when their actual values are set.

        Assert(value != nullptr || IsInternalPropertyId(propertyId));

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        if (index != Constants::NoSlot)
        {
            // If type is shared then the handler must be shared as well.  This is a weaker invariant than in AddPropertyInternal,
            // because the type coming in here may be the result of DynamicObject::ChangeType(). In that case the handler may have
            // already been shared, but the newly created type isn't - and likely never will be - shared (is typically unreachable).
            // In CacheOperators::CachePropertyWrite we ensure that we never cache property adds for types that aren't shared.
            Assert(!instance->GetDynamicType()->GetIsShared() || GetIsShared());

            bool setAttrDone;
            if (setAttributes)
            {
                setAttrDone = this->SetAttributesHelper(instance, propertyId, index, GetAttributeArray(), attr, true);
                if (!setAttrDone)
                {
                    return instance->GetTypeHandler()->SetPropertyWithAttributes(instance, propertyId, value, attr, info, flags, possibleSideEffects);
                }
            }
            else if (isInit)
            {
                ObjectSlotAttributes * attributes = this->GetAttributeArray();
                if (attributes && (attributes[index] & ObjectSlotAttr_Accessor))
                {
                    setAttrDone = this->SetAttributesHelper(instance, propertyId, index, attributes, (ObjectSlotAttributes)(attributes[index] & ~ObjectSlotAttr_Accessor), true);
                    if (!setAttrDone)
                    {
                        return instance->GetTypeHandler()->InitProperty(instance, propertyId, value, flags, info);
                    }
                    // We're changing an accessor into a data property at object init time. Don't cache this transition from setter to non-setter,
                    // as it behaves differently from a normal set property.
                    PropertyValueInfo::SetNoCache(info, instance);
                    newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
                    newTypeHandler->SetSlotUnchecked(instance, index, value);
                    return true;
                }
            }
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
            newTypeHandler->SetSlotAndCache(instance, propertyId, nullptr, index, value, info, flags, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. This may create an objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            if (setAttributes)
            {
                if (attr != ObjectSlotAttr_Default)
                {
                    return this->ConvertToTypeWithItemAttributes(instance)->SetItemWithAttributes(instance, indexVal, value, ObjectSlotAttributesToPropertyAttributes(attr));
                }
            }
            return PathTypeHandlerBase::SetItem(instance, indexVal, value, PropertyOperation_None);
        }

        return PathTypeHandlerBase::AddPropertyInternal(instance, propertyId, value, attr, info, flags, possibleSideEffects);
    }